

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O2

void __thiscall mocker::ir::Assign::~Assign(Assign *this)

{
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Assign_0012a360;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Assign_0012a380;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->operand).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Definition::~Definition(&this->super_Definition);
  return;
}

Assistant:

Assign(std::shared_ptr<Reg> dest, std::shared_ptr<Addr> operand)
      : IRInst(InstType::Assign), Definition(std::move(dest)),
        operand(std::move(operand)) {}